

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[59],std::__cxx11::string,char[20],std::__cxx11::string,char[171],std::basic_string_view<char,std::char_traits<char>>,char[42],std::basic_string_view<char,std::char_traits<char>>,char[6]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [59],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [20],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [171],basic_string_view<char,_std::char_traits<char>_> *args_5,
                   char (*args_6) [42],basic_string_view<char,_std::char_traits<char>_> *args_7,
                   char (*args_8) [6])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view view;
  string_view view_00;
  cmAlphaNum local_2c8;
  size_t local_298;
  char *local_290;
  cmAlphaNum local_288;
  cmAlphaNum local_258;
  size_t local_228;
  char *local_220;
  cmAlphaNum local_218;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  cmAlphaNum local_128;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [20];
  char (*args_local_2) [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [59];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [20])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [59])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_f8 = cmAlphaNum::View(a);
  local_e8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_128,(char *)args_local_1);
  local_d8 = cmAlphaNum::View(&local_128);
  cmAlphaNum::cmAlphaNum(&local_158,(string *)args_local_2);
  local_c8 = cmAlphaNum::View(&local_158);
  cmAlphaNum::cmAlphaNum(&local_188,*local_38);
  local_b8 = cmAlphaNum::View(&local_188);
  cmAlphaNum::cmAlphaNum(&local_1b8,args_3);
  local_a8 = cmAlphaNum::View(&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1e8,*args_4);
  local_98 = cmAlphaNum::View(&local_1e8);
  local_228 = args_5->_M_len;
  local_220 = args_5->_M_str;
  view._M_len = args_5->_M_len;
  view._M_str = args_5->_M_str;
  cmAlphaNum::cmAlphaNum(&local_218,view);
  local_88 = cmAlphaNum::View(&local_218);
  cmAlphaNum::cmAlphaNum(&local_258,*args_6);
  local_78 = cmAlphaNum::View(&local_258);
  local_298 = args_7->_M_len;
  local_290 = args_7->_M_str;
  view_00._M_len = args_7->_M_len;
  view_00._M_str = args_7->_M_str;
  cmAlphaNum::cmAlphaNum(&local_288,view_00);
  local_68 = cmAlphaNum::View(&local_288);
  cmAlphaNum::cmAlphaNum(&local_2c8,*args_8);
  local_58 = cmAlphaNum::View(&local_2c8);
  local_48 = &local_f8;
  local_40 = 0xb;
  views._M_len = 0xb;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}